

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O1

iterator anon_unknown.dwarf_1900a8::findByNameOrAlias<VulkanHppGenerator::CommandData>
                   (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::CommandData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::CommandData>_>_>
                    *values,string *name)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr __n;
  int iVar2;
  iterator iVar3;
  const_iterator cVar4;
  
  iVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::CommandData>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::CommandData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::CommandData>_>_>
          ::find(&values->_M_t,name);
  p_Var1 = &(values->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)iVar3._M_node == p_Var1) {
    for (iVar3._M_node = (values->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        ((_Rb_tree_header *)iVar3._M_node != p_Var1 &&
        (((__n = iVar3._M_node[1]._M_parent, __n != (_Base_ptr)name->_M_string_length ||
          ((__n != (_Base_ptr)0x0 &&
           (iVar2 = bcmp(*(void **)(iVar3._M_node + 1),(name->_M_dataplus)._M_p,(size_t)__n),
           iVar2 != 0)))) &&
         (cVar4 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                  ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                          *)(iVar3._M_node + 2),name),
         cVar4._M_node == (_Base_ptr)&iVar3._M_node[2]._M_parent))));
        iVar3._M_node = (_Base_ptr)std::_Rb_tree_increment(iVar3._M_node)) {
    }
  }
  if ((_Rb_tree_header *)iVar3._M_node != p_Var1) {
    return (iterator)iVar3._M_node;
  }
  __assert_fail("it != values.end()",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                ,0x424e,
                "typename std::map<std::string, T>::iterator (anonymous namespace)::findByNameOrAlias(std::map<std::string, T> &, const std::string &) [T = VulkanHppGenerator::CommandData]"
               );
}

Assistant:

typename std::map<std::string, T>::iterator findByNameOrAlias( std::map<std::string, T> & values, std::string const & name )
  {
    auto it = values.find( name );
    if ( it == values.end() )
    {
      it = std::ranges::find_if( values, [&name]( auto const & value ) { return ( value.first == name ) || value.second.aliases.contains( name ); } );
    }
    assert( it != values.end() );
    return it;
  }